

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void assert_consistency(quicly_conn_t *conn,int timer_must_be_in_future)

{
  int in_ESI;
  long in_RDI;
  
  if (*(uint *)(in_RDI + 8) < 3) {
    if ((*(long *)(in_RDI + 0x648) == 0) && ((*(byte *)(in_RDI + 0x2f8) >> 1 & 1) == 0)) {
      if (*(long *)(in_RDI + 0x610) != 0x7fffffffffffffff) {
        __assert_fail("conn->egress.loss.loss_time == INT64_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x2ea,"void assert_consistency(quicly_conn_t *, int)");
      }
    }
    else if (*(long *)(in_RDI + 0x618) == 0x7fffffffffffffff) {
      __assert_fail("conn->egress.loss.alarm_at != INT64_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x2e8,"void assert_consistency(quicly_conn_t *, int)");
    }
    if (((in_ESI != 0) && ((*(byte *)(in_RDI + 0x2f8) & 1) != 0)) &&
       (*(long *)(in_RDI + 0x618) <= *(long *)(in_RDI + 0x9c0))) {
      __assert_fail("conn->stash.now < conn->egress.loss.alarm_at",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x2ef,"void assert_consistency(quicly_conn_t *, int)");
    }
  }
  else if ((in_ESI != 0) && (*(long *)(in_RDI + 0x730) <= *(long *)(in_RDI + 0x9c0))) {
    __assert_fail("!timer_must_be_in_future || conn->stash.now < conn->egress.send_ack_at",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x2e3,"void assert_consistency(quicly_conn_t *, int)");
  }
  return;
}

Assistant:

static void assert_consistency(quicly_conn_t *conn, int timer_must_be_in_future)
{
    if (conn->super.state >= QUICLY_STATE_CLOSING) {
        assert(!timer_must_be_in_future || conn->stash.now < conn->egress.send_ack_at);
        return;
    }

    if (conn->egress.loss.sentmap.bytes_in_flight != 0 || conn->super.remote.address_validation.send_probe) {
        assert(conn->egress.loss.alarm_at != INT64_MAX);
    } else {
        assert(conn->egress.loss.loss_time == INT64_MAX);
    }
    /* Allow timers not in the future when the remote peer is not yet validated, since we may not be able to send packets even when
     * timers fire. */
    if (timer_must_be_in_future && conn->super.remote.address_validation.validated)
        assert(conn->stash.now < conn->egress.loss.alarm_at);
}